

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_keyexpimp.c
# Opt level: O1

int gost_kimp15(uchar *expkey,size_t expkeylen,int cipher_nid,uchar *cipher_key,int mac_nid,
               uchar *mac_key,uchar *iv,size_t ivlen,uchar *shared_key)

{
  int iVar1;
  EVP_CIPHER_CTX *ctx;
  char *pcVar2;
  EVP_CIPHER *cipher;
  EVP_MD_CTX *ctx_00;
  EVP_MD *type;
  uint arg;
  int iVar3;
  int len;
  uchar mac_buf [16];
  uchar iv_full [16];
  int local_94;
  uchar *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  uchar local_48 [24];
  
  arg = 8;
  if (cipher_nid != 0x4a4) {
    arg = (uint)(cipher_nid == 0x3f5) << 4;
  }
  if (arg == 0) {
    iVar3 = 0x86;
    iVar1 = 0x87;
LAB_0011b37c:
    ERR_GOST_error(0x94,iVar3,
                   "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_keyexpimp.c"
                   ,iVar1);
    ctx = (EVP_CIPHER_CTX *)0x0;
LAB_0011b383:
    ctx_00 = (EVP_MD_CTX *)0x0;
  }
  else {
    if (0x30 < expkeylen) {
      iVar3 = 0xc0103;
      iVar1 = 0x8c;
      goto LAB_0011b37c;
    }
    if (0x10 < ivlen) {
      iVar3 = 0xc0103;
      iVar1 = 0x91;
      goto LAB_0011b37c;
    }
    local_48[0] = '\0';
    local_48[1] = '\0';
    local_48[2] = '\0';
    local_48[3] = '\0';
    local_48[4] = '\0';
    local_48[5] = '\0';
    local_48[6] = '\0';
    local_48[7] = '\0';
    local_48[8] = '\0';
    local_48[9] = '\0';
    local_48[10] = '\0';
    local_48[0xb] = '\0';
    local_48[0xc] = '\0';
    local_48[0xd] = '\0';
    local_48[0xe] = '\0';
    local_48[0xf] = '\0';
    local_90 = mac_key;
    memcpy(local_48,iv,ivlen);
    ctx = EVP_CIPHER_CTX_new();
    if (ctx == (EVP_CIPHER_CTX *)0x0) {
      iVar3 = 0xc0100;
      iVar1 = 0x9b;
      goto LAB_0011b37c;
    }
    pcVar2 = OBJ_nid2sn(cipher_nid);
    cipher = EVP_get_cipherbyname(pcVar2);
    iVar3 = 0;
    iVar1 = EVP_CipherInit_ex(ctx,cipher,(ENGINE *)0x0,(uchar *)0x0,(uchar *)0x0,0);
    if (iVar1 < 1) {
LAB_0011b346:
      ERR_GOST_error(0x94,0xc0103,
                     "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_keyexpimp.c"
                     ,0xa4);
      ctx_00 = (EVP_MD_CTX *)0x0;
      goto LAB_0011b389;
    }
    iVar1 = EVP_CipherInit_ex(ctx,(EVP_CIPHER *)0x0,(ENGINE *)0x0,cipher_key,local_48,0);
    if (iVar1 < 1) goto LAB_0011b346;
    iVar1 = EVP_CipherUpdate(ctx,(uchar *)&local_88,&local_94,expkey,(int)expkeylen);
    if (iVar1 < 1) goto LAB_0011b346;
    iVar1 = EVP_CipherFinal_ex(ctx,(uchar *)((long)&local_88 + (long)local_94),&local_94);
    if (iVar1 < 1) goto LAB_0011b346;
    ctx_00 = (EVP_MD_CTX *)EVP_MD_CTX_new();
    if (ctx_00 == (EVP_MD_CTX *)0x0) {
      ERR_GOST_error(0x94,0xc0100,
                     "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_keyexpimp.c"
                     ,0xab);
      goto LAB_0011b383;
    }
    pcVar2 = OBJ_nid2sn(mac_nid);
    type = EVP_get_digestbyname(pcVar2);
    iVar3 = 0;
    iVar1 = EVP_DigestInit_ex(ctx_00,type,(ENGINE *)0x0);
    if (iVar1 < 1) {
LAB_0011b3ba:
      ERR_GOST_error(0x94,0xc0103,
                     "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_keyexpimp.c"
                     ,0xb6);
      goto LAB_0011b389;
    }
    iVar1 = omac_imit_ctrl((EVP_MD_CTX *)ctx_00,0x1004,0x20,local_90);
    if (iVar1 < 1) goto LAB_0011b3ba;
    iVar1 = omac_imit_ctrl((EVP_MD_CTX *)ctx_00,3,arg,(void *)0x0);
    if (iVar1 < 1) goto LAB_0011b3ba;
    iVar1 = EVP_DigestUpdate(ctx_00,iv,ivlen);
    if (iVar1 < 1) goto LAB_0011b3ba;
    iVar1 = EVP_DigestUpdate(ctx_00,&local_88,0x20);
    if (iVar1 < 1) goto LAB_0011b3ba;
    iVar1 = EVP_DigestFinalXOF(ctx_00,local_58,(ulong)arg);
    if (iVar1 < 1) goto LAB_0011b3ba;
    iVar1 = CRYPTO_memcmp(local_58,local_68,(ulong)arg);
    if (iVar1 == 0) {
      *(undefined8 *)(shared_key + 0x10) = local_78;
      *(undefined8 *)(shared_key + 0x18) = uStack_70;
      *(undefined8 *)shared_key = local_88;
      *(undefined8 *)(shared_key + 8) = uStack_80;
      iVar3 = 1;
      goto LAB_0011b389;
    }
    ERR_GOST_error(0x94,0x85,
                   "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_keyexpimp.c"
                   ,0xbb);
  }
  iVar3 = 0;
LAB_0011b389:
  OPENSSL_cleanse(&local_88,0x30);
  EVP_MD_CTX_free(ctx_00);
  EVP_CIPHER_CTX_free(ctx);
  return iVar3;
}

Assistant:

int gost_kimp15(const unsigned char *expkey, const size_t expkeylen,
                int cipher_nid, const unsigned char *cipher_key,
                int mac_nid, unsigned char *mac_key,
                const unsigned char *iv, const size_t ivlen,
                unsigned char *shared_key)
{
    unsigned char iv_full[16], out[48], mac_buf[16];
    unsigned int mac_len;
    const size_t shared_len = 32;

    EVP_CIPHER_CTX *ciph = NULL;
    EVP_MD_CTX *mac = NULL;

    int ret = 0;
    int len;

    mac_len = (cipher_nid == NID_magma_ctr) ? 8 :
        (cipher_nid == NID_grasshopper_ctr) ? 16 : 0;

    if (mac_len == 0) {
        GOSTerr(GOST_F_GOST_KIMP15, GOST_R_INVALID_CIPHER);
        goto err;
    }

    if (expkeylen > sizeof(out)) {
        GOSTerr(GOST_F_GOST_KIMP15, ERR_R_INTERNAL_ERROR);
        goto err;
    }

    if (ivlen > 16) {
        GOSTerr(GOST_F_GOST_KIMP15, ERR_R_INTERNAL_ERROR);
        goto err;
    }

    /* we expect IV of half length */
    memset(iv_full, 0, 16);
    memcpy(iv_full, iv, ivlen);

    ciph = EVP_CIPHER_CTX_new();
    if (ciph == NULL) {
        GOSTerr(GOST_F_GOST_KIMP15, ERR_R_MALLOC_FAILURE);
        goto err;
    }

    if (EVP_CipherInit_ex
        (ciph, EVP_get_cipherbynid(cipher_nid), NULL, NULL, NULL, 0) <= 0
        || EVP_CipherInit_ex(ciph, NULL, NULL, cipher_key, iv_full, 0) <= 0
        || EVP_CipherUpdate(ciph, out, &len, expkey, expkeylen) <= 0
        || EVP_CipherFinal_ex(ciph, out + len, &len) <= 0) {
        GOSTerr(GOST_F_GOST_KIMP15, ERR_R_INTERNAL_ERROR);
        goto err;
    }
    /*Now we have shared key and mac in out[] */

    mac = EVP_MD_CTX_new();
    if (mac == NULL) {
        GOSTerr(GOST_F_GOST_KIMP15, ERR_R_MALLOC_FAILURE);
        goto err;
    }

    if (EVP_DigestInit_ex(mac, EVP_get_digestbynid(mac_nid), NULL) <= 0
        || omac_imit_ctrl(mac, EVP_MD_CTRL_SET_KEY, 32, mac_key) <= 0
        || omac_imit_ctrl(mac, EVP_MD_CTRL_XOF_LEN, mac_len, NULL) <= 0
        || EVP_DigestUpdate(mac, iv, ivlen) <= 0
        || EVP_DigestUpdate(mac, out, shared_len) <= 0
        /* As we set MAC length directly, we should not allow overwriting it */
        || EVP_DigestFinalXOF(mac, mac_buf, mac_len) <= 0) {
        GOSTerr(GOST_F_GOST_KIMP15, ERR_R_INTERNAL_ERROR);
        goto err;
    }

    if (CRYPTO_memcmp(mac_buf, out + shared_len, mac_len) != 0) {
        GOSTerr(GOST_F_GOST_KIMP15, GOST_R_BAD_MAC);
        goto err;
    }

    memcpy(shared_key, out, shared_len);
    ret = 1;

 err:
    OPENSSL_cleanse(out, sizeof(out));
    EVP_MD_CTX_free(mac);
    EVP_CIPHER_CTX_free(ciph);
    return ret;
}